

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

double calc_frame_boost(PRIMARY_RATE_CONTROL *p_rc,FRAME_INFO *frame_info,
                       FIRSTPASS_STATS *this_frame,double this_frame_mv_in_out,double max_boost)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = av1_convert_qindex_to_q((int)p_rc,frame_info->bit_depth);
  dVar1 = dVar1 * 0.015 + 0.5;
  if (1.5 <= dVar1) {
    dVar1 = 1.5;
  }
  dVar3 = 1.0 - ((this_frame->inactive_zone_rows * 2.0) / (double)frame_info->mb_rows +
                this_frame->intra_skip_pct * 0.5);
  dVar2 = 1.0;
  if (dVar3 <= 1.0) {
    dVar2 = dVar3;
  }
  dVar3 = (double)(-(ulong)(dVar3 < 0.5) & 0x3fe0000000000000 |
                  ~-(ulong)(dVar3 < 0.5) & (ulong)dVar2);
  dVar2 = dVar3 * *(double *)
                   (&DAT_004fc760 +
                   (ulong)((uint)(frame_info->frame_height * frame_info->frame_width) < 0x38401) * 8
                   );
  dVar3 = this_frame->intra_error * dVar3;
  if (dVar2 <= dVar3) {
    dVar2 = dVar3;
  }
  dVar2 = (dVar2 / (this_frame->coded_error +
                   *(double *)(&DAT_004d9c40 + (ulong)(this_frame->coded_error < 0.0) * 8))) * 12.5
          * dVar1;
  dVar2 = (double)(~-(ulong)(0.0 < this_frame_mv_in_out) & 0x3fe0000000000000 |
                  -(ulong)(0.0 < this_frame_mv_in_out) & 0x4000000000000000) * this_frame_mv_in_out
          * dVar2 + dVar2;
  if (dVar1 * 90.0 <= dVar2) {
    dVar2 = dVar1 * 90.0;
  }
  return dVar2;
}

Assistant:

static double calc_frame_boost(const PRIMARY_RATE_CONTROL *p_rc,
                               const FRAME_INFO *frame_info,
                               const FIRSTPASS_STATS *this_frame,
                               double this_frame_mv_in_out, double max_boost) {
  double frame_boost;
  const double lq = av1_convert_qindex_to_q(p_rc->avg_frame_qindex[INTER_FRAME],
                                            frame_info->bit_depth);
  const double boost_q_correction = AOMMIN((0.5 + (lq * 0.015)), 1.5);
  const double active_area = calculate_active_area(frame_info, this_frame);

  // Underlying boost factor is based on inter error ratio.
  frame_boost = AOMMAX(baseline_err_per_mb(frame_info) * active_area,
                       this_frame->intra_error * active_area) /
                DOUBLE_DIVIDE_CHECK(this_frame->coded_error);
  frame_boost = frame_boost * BOOST_FACTOR * boost_q_correction;

  // Increase boost for frames where new data coming into frame (e.g. zoom out).
  // Slightly reduce boost if there is a net balance of motion out of the frame
  // (zoom in). The range for this_frame_mv_in_out is -1.0 to +1.0.
  if (this_frame_mv_in_out > 0.0)
    frame_boost += frame_boost * (this_frame_mv_in_out * 2.0);
  // In the extreme case the boost is halved.
  else
    frame_boost += frame_boost * (this_frame_mv_in_out / 2.0);

  return AOMMIN(frame_boost, max_boost * boost_q_correction);
}